

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2crossing_edge_query.cc
# Opt level: O3

void __thiscall
S2CrossingEdgeQuery::SplitUBound
          (S2CrossingEdgeQuery *this,R2Rect *edge_bound,double u,R2Rect *child_bounds)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  S2LogMessage local_28;
  
  dVar1 = (this->a0_).c_[0];
  dVar2 = (this->a0_).c_[1];
  dVar3 = (this->a1_).c_[0];
  dVar4 = (this->a1_).c_[1];
  if ((dVar1 == dVar3) && (!NAN(dVar1) && !NAN(dVar3))) {
    S2LogMessage::S2LogMessage
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_clipping.h"
               ,0xab,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_28.stream_,"Check failed: (a) != (b) ",0x19);
    abort();
  }
  if (ABS(dVar1 - u) <= ABS(dVar3 - u)) {
    dVar4 = dVar2 + ((dVar4 - dVar2) * (u - dVar1)) / (dVar3 - dVar1);
  }
  else {
    dVar4 = dVar4 + ((dVar2 - dVar4) * (u - dVar3)) / (dVar1 - dVar3);
  }
  dVar4 = R1Interval::Project(edge_bound->bounds_ + 1,dVar4);
  SplitBound(edge_bound,0,u,
             -(uint)((this->a1_).c_[0] < (this->a0_).c_[0] != (this->a1_).c_[1] < (this->a0_).c_[1])
             & 1,dVar4,child_bounds);
  return;
}

Assistant:

void S2CrossingEdgeQuery::SplitUBound(const R2Rect& edge_bound, double u,
                                      R2Rect child_bounds[2]) const {
  // See comments in MutableS2ShapeIndex::ClipUBound.
  double v = edge_bound[1].Project(
      S2::InterpolateDouble(u, a0_[0], a1_[0], a0_[1], a1_[1]));

  // "diag_" indicates which diagonal of the bounding box is spanned by a0a1:
  // it is 0 if a0a1 has positive slope, and 1 if a0a1 has negative slope.
  int diag = (a0_[0] > a1_[0]) != (a0_[1] > a1_[1]);
  SplitBound(edge_bound, 0, u, diag, v, child_bounds);
}